

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts3ExprFree(Fts3Expr *pDel)

{
  Fts3Phrase *pPhrase;
  Fts3Expr *pFVar1;
  Fts3Expr *pFVar2;
  Fts3Expr *pFVar3;
  Fts3MultiSegReader **ppFVar4;
  long lVar5;
  
  do {
    pFVar3 = pDel;
    if (pFVar3 == (Fts3Expr *)0x0) break;
    pDel = pFVar3->pLeft;
  } while ((pFVar3->pLeft != (Fts3Expr *)0x0) ||
          (pDel = pFVar3->pRight, pFVar3->pRight != (Fts3Expr *)0x0));
  while (pFVar2 = pFVar3, pFVar2 != (Fts3Expr *)0x0) {
    pFVar1 = pFVar2->pParent;
    pPhrase = pFVar2->pPhrase;
    if (pPhrase != (Fts3Phrase *)0x0) {
      sqlite3_free((pPhrase->doclist).aAll);
      fts3EvalInvalidatePoslist(pPhrase);
      *(undefined8 *)&(pPhrase->doclist).bFreeList = 0;
      (pPhrase->doclist).pList = (char *)0x0;
      *(undefined8 *)&(pPhrase->doclist).nList = 0;
      (pPhrase->doclist).pNextDocid = (char *)0x0;
      (pPhrase->doclist).iDocid = 0;
      (pPhrase->doclist).aAll = (char *)0x0;
      *(undefined8 *)&(pPhrase->doclist).nAll = 0;
      ppFVar4 = &pPhrase->aToken[0].pSegcsr;
      for (lVar5 = 0; lVar5 < pPhrase->nToken; lVar5 = lVar5 + 1) {
        fts3SegReaderCursorFree(*ppFVar4);
        *ppFVar4 = (Fts3MultiSegReader *)0x0;
        ppFVar4 = ppFVar4 + 5;
      }
    }
    sqlite3_free(pFVar2->aMI);
    sqlite3_free(pFVar2);
    pFVar3 = (Fts3Expr *)0x0;
    if ((pFVar1 != (Fts3Expr *)0x0) && (pFVar3 = pFVar1, pFVar2 == pFVar1->pLeft)) {
      pFVar2 = pFVar1->pRight;
      while (pFVar3 = pFVar1, pFVar2 != (Fts3Expr *)0x0) {
        do {
          pFVar1 = pFVar2;
          pFVar2 = pFVar1->pLeft;
        } while (pFVar1->pLeft != (Fts3Expr *)0x0);
        pFVar2 = pFVar1->pRight;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3ExprFree(Fts3Expr *pDel){
  Fts3Expr *p;
  assert( pDel==0 || pDel->pParent==0 );
  for(p=pDel; p && (p->pLeft||p->pRight); p=(p->pLeft ? p->pLeft : p->pRight)){
    assert( p->pParent==0 || p==p->pParent->pRight || p==p->pParent->pLeft );
  }
  while( p ){
    Fts3Expr *pParent = p->pParent;
    fts3FreeExprNode(p);
    if( pParent && p==pParent->pLeft && pParent->pRight ){
      p = pParent->pRight;
      while( p && (p->pLeft || p->pRight) ){
        assert( p==p->pParent->pRight || p==p->pParent->pLeft );
        p = (p->pLeft ? p->pLeft : p->pRight);
      }
    }else{
      p = pParent;
    }
  }
}